

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O3

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (double *__result,double *__a,double *__b,double *__c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  dVar6 = (double)*(int *)(__a + 2);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *__b;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *__a;
  auVar10 = vunpcklpd_avx(auVar10,auVar8);
  auVar11._8_8_ = dVar6;
  auVar11._0_8_ = dVar6;
  auVar10 = vdivpd_avx(auVar10,auVar11);
  auVar11 = vshufpd_avx(auVar10,auVar10,1);
  dVar9 = auVar10._0_8_;
  if (auVar11._0_8_ <= dVar9) {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *__c;
    if (*__c / dVar6 <= dVar9) {
      auVar7._0_8_ = (double)*(int *)(__b + 2);
      auVar10 = vunpcklpd_avx(auVar8,auVar13);
      auVar7._8_8_ = auVar7._0_8_;
      auVar10 = vdivpd_avx(auVar10,auVar7);
      auVar11 = vshufpd_avx(auVar10,auVar10,1);
      if (auVar10._0_8_ < auVar11._0_8_) goto LAB_0058663e;
      goto LAB_0058665e;
    }
  }
  else {
    auVar14._0_8_ = (double)*(int *)(__b + 2);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *__c;
    auVar10 = vunpcklpd_avx(auVar8,auVar12);
    auVar14._8_8_ = auVar14._0_8_;
    auVar10 = vdivpd_avx(auVar10,auVar14);
    auVar11 = vshufpd_avx(auVar10,auVar10,1);
    if (auVar10._0_8_ < auVar11._0_8_) {
LAB_0058665e:
      dVar6 = *__result;
      dVar9 = __result[1];
      dVar1 = __result[2];
      dVar2 = __result[3];
      dVar3 = __b[1];
      dVar4 = __b[2];
      dVar5 = __b[3];
      *__result = *__b;
      __result[1] = dVar3;
      __result[2] = dVar4;
      __result[3] = dVar5;
      *__b = dVar6;
      __b[1] = dVar9;
      __b[2] = dVar1;
      __b[3] = dVar2;
      return;
    }
    if (dVar9 < *__c / dVar6) {
LAB_0058663e:
      dVar6 = *__result;
      dVar9 = __result[1];
      dVar1 = __result[2];
      dVar2 = __result[3];
      dVar3 = __c[1];
      dVar4 = __c[2];
      dVar5 = __c[3];
      *__result = *__c;
      __result[1] = dVar3;
      __result[2] = dVar4;
      __result[3] = dVar5;
      *__c = dVar6;
      __c[1] = dVar9;
      __c[2] = dVar1;
      __c[3] = dVar2;
      return;
    }
  }
  dVar6 = *__result;
  dVar9 = __result[1];
  dVar1 = __result[2];
  dVar2 = __result[3];
  dVar3 = __a[1];
  dVar4 = __a[2];
  dVar5 = __a[3];
  *__result = *__a;
  __result[1] = dVar3;
  __result[2] = dVar4;
  __result[3] = dVar5;
  *__a = dVar6;
  __a[1] = dVar9;
  __a[2] = dVar1;
  __a[3] = dVar2;
  return;
}

Assistant:

constexpr bool operator<(const item& other) const noexcept
        {
            if constexpr (std::is_same_v<Mode, minimize_tag>)
                return (r / static_cast<Float>(factor)) <
                       (other.r / static_cast<Float>(factor));
            else
                return (other.r / static_cast<Float>(factor)) <
                       (r / static_cast<Float>(factor));
        }